

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_cimg
          (CImg<unsigned_char> *this,char *filename,char axis,float align)

{
  CImg<unsigned_char> *pCVar1;
  CImgList<unsigned_char> list;
  CImgList<unsigned_char> local_48;
  CImg<unsigned_char> local_30;
  
  local_48._width = 0;
  local_48._allocated_width = 0;
  local_48._data = (CImg<unsigned_char> *)0x0;
  CImgList<unsigned_char>::load_cimg(&local_48,filename);
  if (local_48._width == 1) {
    pCVar1 = move_to(local_48._data,this);
  }
  else {
    CImgList<unsigned_char>::get_append(&local_30,&local_48,axis,align);
    pCVar1 = assign<unsigned_char>(this,&local_30);
    ~CImg(&local_30);
  }
  CImgList<unsigned_char>::~CImgList(&local_48);
  return pCVar1;
}

Assistant:

CImg<T>& load_cimg(const char *const filename, const char axis='z', const float align=0) {
      CImgList<T> list;
      list.load_cimg(filename);
      if (list._width==1) return list[0].move_to(*this);
      return assign(list.get_append(axis,align));
    }